

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQTable *pSVar1;
  SQUnsignedInteger SVar2;
  SQObjectPtr *in_RDI;
  SQInteger _n_;
  SQUnsignedInteger nvalues;
  long local_18;
  
  SVar2 = sqvector<SQClassMember>::size
                    ((sqvector<SQClassMember> *)
                     &((in_RDI[3].super_SQObject._unVal.pArray)->_values)._allocated);
  if (in_RDI[3].super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar1 = in_RDI[3].super_SQObject._unVal.pTable;
    (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
    if (((in_RDI[3].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._uiRef == 0) {
      (*((in_RDI[3].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    in_RDI[3].super_SQObject._unVal.pTable = (SQTable *)0x0;
  }
  for (local_18 = 0; local_18 < (long)SVar2; local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(in_RDI);
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}